

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::View<TestType,_true,_std::allocator<unsigned_long>_>::indexToOffset
          (View<TestType,_true,_std::allocator<unsigned_long>_> *this,size_t index,size_t *out)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t j;
  ulong j_00;
  geometry_type *pgVar5;
  
  testInvariant(this);
  marray_detail::Assert<bool>(index < (this->geometry_).size_);
  bVar1 = isSimple(this);
  if (bVar1) {
    *out = index;
  }
  else {
    *out = 0;
    testInvariant(this);
    if ((this->geometry_).coordinateOrder_ == FirstMajorOrder) {
      pgVar5 = &this->geometry_;
      j_00 = 0;
      while( true ) {
        sVar2 = dimension(this);
        if (sVar2 <= j_00) break;
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides(pgVar5,j_00);
        sVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides(pgVar5,j_00);
        *out = *out + (index / sVar3) * sVar2;
        sVar2 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides(pgVar5,j_00);
        index = index % sVar2;
        j_00 = j_00 + 1;
      }
    }
    else {
      sVar2 = dimension(this);
      if (sVar2 == 0) {
        marray_detail::Assert<bool>(index == 0);
        return;
      }
      sVar2 = dimension(this);
      pgVar5 = &this->geometry_;
      while( true ) {
        sVar2 = sVar2 - 1;
        sVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::strides(pgVar5,sVar2);
        sVar4 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides(pgVar5,sVar2);
        *out = *out + (index / sVar4) * sVar3;
        sVar3 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides(pgVar5,sVar2);
        if (sVar2 == 0) break;
        index = index % sVar3;
      }
    }
  }
  return;
}

Assistant:

inline void
View<T, isConst, A>::indexToOffset
(
    std::size_t index,
    std::size_t& out
) const
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_ARG_TEST || index < this->size()); 
    if(isSimple()) {
        out = index;
    }
    else {
        out = 0;
        if(coordinateOrder() == FirstMajorOrder) {
            for(std::size_t j=0; j<this->dimension(); ++j) {
                out += geometry_.strides(j) * (index / geometry_.shapeStrides(j));
                index = index % geometry_.shapeStrides(j);
            }
        }
        else { // last major order
            if(this->dimension() == 0) {
                marray_detail::Assert(MARRAY_NO_ARG_TEST || index == 0);
                return;
            }
            else {
                std::size_t j = this->dimension()-1;
                for(;;) {
                    out += geometry_.strides(j) * (index / geometry_.shapeStrides(j));
                    index = index % geometry_.shapeStrides(j);
                    if(j == 0) {
                        break;
                    }
                    else {
                        --j;
                    }
                }
            }
        }
    }
}